

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  ImGuiTableColumn *pIVar1;
  void *__s;
  short *psVar2;
  ImGuiTableCellData *pIVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int local_58 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  int iStack_30;
  int iStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_58[0] = 0;
  local_58[1] = 0;
  local_38 = 0;
  uStack_20 = 0;
  iStack_30 = columns_count * 0x70;
  iStack_2c = columns_count * 2;
  local_48 = ((ulong)(iStack_30 + 3) & 0xfffffffc) << 0x20;
  uVar6 = columns_count * 0x72 + 3;
  iVar4 = (uVar6 & 0xfffffffc) + columns_count * 8;
  uStack_40 = (ulong)uVar6 & 0xfffffffffffffffc;
  local_28 = (ulong)(uint)(columns_count << 3);
  uVar6 = columns_count + 0x1f >> 3 & 0xfffffffc;
  lVar5 = 7;
  do {
    local_58[lVar5] = iVar4;
    *(uint *)((long)&uStack_40 + lVar5 * 4) = uVar6;
    iVar4 = iVar4 + uVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  local_58[3] = 6;
  local_58[2] = iVar4;
  __s = MemAlloc((long)iVar4);
  table->RawData = __s;
  memset(__s,0,(long)iVar4);
  pIVar1 = (ImGuiTableColumn *)table->RawData;
  (table->Columns).Data = pIVar1;
  (table->Columns).DataEnd = (ImGuiTableColumn *)((long)&pIVar1->Flags + (long)iStack_30);
  psVar2 = (short *)((long)&pIVar1->Flags + (long)local_48._4_4_);
  (table->DisplayOrderToIndex).Data = psVar2;
  (table->DisplayOrderToIndex).DataEnd = (short *)((long)iStack_2c + (long)psVar2);
  pIVar3 = (ImGuiTableCellData *)((long)&pIVar1->Flags + (long)(int)uStack_40);
  (table->RowCellData).Data = pIVar3;
  (table->RowCellData).DataEnd =
       (ImGuiTableCellData *)((long)&pIVar3->BgColor + (long)(int)local_28);
  table->EnabledMaskByDisplayOrder = (ImBitArrayPtr)((long)&pIVar1->Flags + (long)uStack_40._4_4_);
  table->EnabledMaskByIndex = (ImBitArrayPtr)((long)&pIVar1->Flags + (long)(int)local_38);
  table->VisibleMaskByIndex = (ImBitArrayPtr)((long)&pIVar1->Flags + (long)local_38._4_4_);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    const int columns_bit_array_size = (int)ImBitArrayGetStorageSizeInBytes(columns_count);
    ImSpanAllocator<6> span_allocator;
    span_allocator.Reserve(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.Reserve(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.Reserve(2, columns_count * sizeof(ImGuiTableCellData), 4);
    for (int n = 3; n < 6; n++)
        span_allocator.Reserve(n, columns_bit_array_size);
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
    table->EnabledMaskByDisplayOrder = (ImU32*)span_allocator.GetSpanPtrBegin(3);
    table->EnabledMaskByIndex = (ImU32*)span_allocator.GetSpanPtrBegin(4);
    table->VisibleMaskByIndex = (ImU32*)span_allocator.GetSpanPtrBegin(5);
}